

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  undefined1 local_60 [8];
  string file_name;
  int local_1c [2];
  int line_local;
  
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_1c[0] = (int)file;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,(char *)this,(allocator<char> *)(file_name.field_2._M_local_buf + 8)
            );
  if ((int)file < 0) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,":"
                  );
  }
  else {
    std::operator+(&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,":"
                  );
    StreamableToString<int>(&local_80,local_1c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file_name.field_2 + 8),&local_a0,&local_80);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file_name.field_2 + 8),":");
    std::__cxx11::string::~string((string *)(file_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}